

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O0

void __thiscall Fl_RGB_Image::~Fl_RGB_Image(Fl_RGB_Image *this)

{
  Fl_RGB_Image *this_local;
  
  (this->super_Fl_Image)._vptr_Fl_Image = (_func_int **)&PTR__Fl_RGB_Image_002ec528;
  (*(this->super_Fl_Image)._vptr_Fl_Image[8])();
  if ((this->alloc_array != 0) && (this->array != (uchar *)0x0)) {
    operator_delete__(this->array);
  }
  Fl_Image::~Fl_Image(&this->super_Fl_Image);
  return;
}

Assistant:

Fl_RGB_Image::~Fl_RGB_Image() {
#ifdef __APPLE__
  if (id_) CGImageRelease((CGImageRef)id_);
  else if (alloc_array) delete[] (uchar *)array;
#else
  uncache();
  if (alloc_array) delete[] (uchar *)array;
#endif
}